

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

BoundedType * __thiscall BoundedType::Get(BoundedType *this,int32_t max_val)

{
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> this_00;
  ExtensionTypeInfo *this_01;
  pointer this_02;
  templated_unique_single_t info;
  _Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false> local_90;
  ExtensionTypeInfo *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  Value local_60 [64];
  
  duckdb::LogicalType::LogicalType((LogicalType *)this,INTEGER);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"BOUNDED","");
  duckdb::LogicalType::SetAlias(this,local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  local_90._M_head_impl = (ExtensionTypeInfo *)operator_new(0x50);
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_90._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_buckets = (__buckets_ptr)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_bucket_count = 0;
  ((local_90._M_head_impl)->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_element_count = 0;
  *(undefined8 *)&((local_90._M_head_impl)->properties)._M_h._M_rehash_policy = 0;
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_90._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
   &(local_90._M_head_impl)->modifiers)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_90._M_head_impl)->properties)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_buckets =
       &((local_90._M_head_impl)->properties)._M_h._M_single_bucket;
  ((local_90._M_head_impl)->properties)._M_h._M_bucket_count = 1;
  ((local_90._M_head_impl)->properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_90._M_head_impl)->properties)._M_h._M_element_count = 0;
  ((local_90._M_head_impl)->properties)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this_02 = duckdb::
            unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                          *)&local_90);
  duckdb::Value::INTEGER((int)local_60);
  std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
  emplace_back<duckdb::Value>
            ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
             this_02,local_60);
  duckdb::Value::~Value(local_60);
  local_88 = local_90._M_head_impl;
  local_90._M_head_impl = (ExtensionTypeInfo *)0x0;
  duckdb::LogicalType::SetExtensionInfo(this);
  this_01 = local_88;
  if (local_88 != (ExtensionTypeInfo *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(local_88->properties)._M_h);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               this_01);
    operator_delete(this_01);
  }
  this_00._M_head_impl = local_90._M_head_impl;
  local_88 = (ExtensionTypeInfo *)0x0;
  if (local_90._M_head_impl != (ExtensionTypeInfo *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&((local_90._M_head_impl)->properties)._M_h);
    std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::~vector
              ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
               this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  return this;
}

Assistant:

static LogicalType Get(int32_t max_val) {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("BOUNDED");
		auto info = make_uniq<ExtensionTypeInfo>();
		info->modifiers.emplace_back(Value::INTEGER(max_val));
		type.SetExtensionInfo(std::move(info));
		return type;
	}